

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,TextureCubeArrayView *src,float *texCoord,ReferenceParams *params
               )

{
  undefined1 local_68 [8];
  Vec4 qq;
  Vec4 rq;
  Vec4 tq;
  Vec4 sq;
  ReferenceParams *params_local;
  float *texCoord_local;
  TextureCubeArrayView *src_local;
  SurfaceAccess *dst_local;
  
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(tq.m_data + 2),*texCoord,texCoord[4],texCoord[8],texCoord[0xc]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(rq.m_data + 2),texCoord[1],texCoord[5],texCoord[9],texCoord[0xd]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(qq.m_data + 2),texCoord[2],texCoord[6],texCoord[10],texCoord[0xe])
  ;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)local_68,texCoord[3],texCoord[7],texCoord[0xb],texCoord[0xf]);
  sampleTextureCubeArray
            (dst,src,(Vec4 *)(tq.m_data + 2),(Vec4 *)(rq.m_data + 2),(Vec4 *)(qq.m_data + 2),
             (Vec4 *)local_68,params);
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::TextureCubeArrayView& src, const float* texCoord, const ReferenceParams& params)
{
	tcu::Vec4 sq = tcu::Vec4(texCoord[0+0], texCoord[4+0], texCoord[8+0], texCoord[12+0]);
	tcu::Vec4 tq = tcu::Vec4(texCoord[0+1], texCoord[4+1], texCoord[8+1], texCoord[12+1]);
	tcu::Vec4 rq = tcu::Vec4(texCoord[0+2], texCoord[4+2], texCoord[8+2], texCoord[12+2]);
	tcu::Vec4 qq = tcu::Vec4(texCoord[0+3], texCoord[4+3], texCoord[8+3], texCoord[12+3]);

	sampleTextureCubeArray(dst, src, sq, tq, rq, qq, params);
}